

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void calc_proj_params_r0_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int64_t (*H) [2],int64_t *C)

{
  undefined8 *puVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int in_ECX;
  int iVar15;
  ulong in_RDX;
  longlong extraout_RDX;
  longlong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  uint uVar18;
  uint uVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i v;
  __m128i v_00;
  long in_stack_00000008;
  __m128i h0x;
  __m128i c;
  __m128i c0_val;
  __m128i h00_val;
  __m128i c0_odd;
  __m128i c0_even;
  __m128i h00_odd;
  __m128i h00_even;
  __m128i s;
  __m128i d;
  __m128i f1;
  __m128i s_load;
  __m128i u_load;
  int j;
  int i;
  __m128i zero;
  __m128i c0;
  __m128i h00;
  uint8_t *dat;
  uint8_t *src;
  int size;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  int local_370;
  int local_36c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  
  iVar15 = (int)in_RDX;
  iVar14 = (int)in_RSI * iVar15;
  for (local_36c = 0; local_36c < iVar15; local_36c = local_36c + 1) {
    for (local_370 = 0; local_370 < (int)in_RSI; local_370 = local_370 + 4) {
      uVar18 = *(uint *)((long)local_370 + in_R8 + local_36c * in_R9D);
      auVar16 = pmovzxbd(ZEXT416(uVar18),uVar18);
      uVar18 = *(uint *)((long)local_370 + in_RDI + local_36c * in_ECX);
      auVar17 = pmovzxbd(ZEXT416(uVar18),uVar18);
      in_RDX = (ulong)(uint)h0x[0];
      puVar1 = (undefined8 *)
               (in_stack_00000008 + (long)(int)(local_36c * (uint)h0x[0]) * 4 + (long)local_370 * 4)
      ;
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      local_158 = auVar16._0_4_;
      iStack_154 = auVar16._4_4_;
      iStack_150 = auVar16._8_4_;
      iStack_14c = auVar16._12_4_;
      local_178 = auVar17._0_4_;
      iStack_174 = auVar17._4_4_;
      iStack_170 = auVar17._8_4_;
      iStack_16c = auVar17._12_4_;
      uVar18 = iStack_174 - iStack_154;
      iStack_16c = iStack_16c - iStack_14c;
      local_218 = (int)uVar4;
      iStack_214 = (int)((ulong)uVar4 >> 0x20);
      iStack_210 = (int)uVar5;
      iStack_20c = (int)((ulong)uVar5 >> 0x20);
      uVar19 = iStack_214 - iStack_154;
      iStack_20c = iStack_20c - iStack_14c;
      local_3a8 = CONCAT44(uVar19,local_218 + local_158 * -0x10);
      uStack_3a0 = CONCAT44(iStack_20c,iStack_210 - iStack_150);
      auVar13._8_8_ = uStack_3a0;
      auVar13._0_8_ = local_3a8;
      auVar12._8_8_ = uStack_3a0;
      auVar12._0_8_ = local_3a8;
      pmuldq(auVar13,auVar12);
      auVar11._4_4_ = 0;
      auVar11._0_4_ = uVar19;
      auVar10._4_4_ = 0;
      auVar10._0_4_ = uVar19;
      auVar11._8_4_ = iStack_20c;
      auVar11._12_4_ = 0;
      auVar10._8_4_ = iStack_20c;
      auVar10._12_4_ = 0;
      pmuldq(auVar11,auVar10);
      auVar8._4_4_ = uVar18;
      auVar8._0_4_ = local_178 * 0x10 + local_158 * -0x10;
      auVar8._12_4_ = iStack_16c;
      auVar8._8_4_ = iStack_170 - iStack_150;
      auVar9._8_8_ = uStack_3a0;
      auVar9._0_8_ = local_3a8;
      pmuldq(auVar9,auVar8);
      auVar7._4_4_ = 0;
      auVar7._0_4_ = uVar19;
      auVar6._4_4_ = 0;
      auVar6._0_4_ = uVar18;
      auVar7._8_4_ = iStack_20c;
      auVar7._12_4_ = 0;
      auVar6._8_4_ = iStack_16c;
      auVar6._12_4_ = 0;
      auVar2._4_8_ = 0;
      auVar2._0_4_ = (int)uVar19 >> 0x1f;
      auVar16._12_4_ = iStack_20c >> 0x1f;
      auVar16._0_12_ = auVar2 << 0x20;
      pblendw(auVar7,auVar16,0xcc);
      auVar3._4_8_ = 0;
      auVar3._0_4_ = (int)uVar18 >> 0x1f;
      auVar17._12_4_ = iStack_16c >> 0x1f;
      auVar17._0_12_ = auVar3 << 0x20;
      pblendw(auVar6,auVar17,0xcc);
      pmuldq(auVar7,auVar6);
    }
  }
  v[1] = in_RDX;
  v[0] = in_RSI;
  xx_storeu_128((void *)c[0],v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storeu_128((void *)h0x[1],v_00);
  *(long *)h0x[1] = *(long *)h0x[1] / (long)iVar14;
  *(long *)c[0] = *(long *)c[0] / (long)iVar14;
  return;
}

Assistant:

static inline void calc_proj_params_r0_sse4_1(const uint8_t *src8, int width,
                                              int height, int src_stride,
                                              const uint8_t *dat8,
                                              int dat_stride, int32_t *flt0,
                                              int flt0_stride, int64_t H[2][2],
                                              int64_t C[2]) {
  const int size = width * height;
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  __m128i h00, c0;
  const __m128i zero = _mm_setzero_si128();
  c0 = h00 = zero;

  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; j += 4) {
      const __m128i u_load = _mm_cvtepu8_epi32(
          _mm_cvtsi32_si128(*((int *)(dat + i * dat_stride + j))));
      const __m128i s_load = _mm_cvtepu8_epi32(
          _mm_cvtsi32_si128(*((int *)(src + i * src_stride + j))));
      __m128i f1 = _mm_loadu_si128((__m128i *)(flt0 + i * flt0_stride + j));
      __m128i d = _mm_slli_epi32(u_load, SGRPROJ_RST_BITS);
      __m128i s = _mm_slli_epi32(s_load, SGRPROJ_RST_BITS);
      s = _mm_sub_epi32(s, d);
      f1 = _mm_sub_epi32(f1, d);

      const __m128i h00_even = _mm_mul_epi32(f1, f1);
      const __m128i h00_odd =
          _mm_mul_epi32(_mm_srli_epi64(f1, 32), _mm_srli_epi64(f1, 32));
      h00 = _mm_add_epi64(h00, h00_even);
      h00 = _mm_add_epi64(h00, h00_odd);

      const __m128i c0_even = _mm_mul_epi32(f1, s);
      const __m128i c0_odd =
          _mm_mul_epi32(_mm_srli_epi64(f1, 32), _mm_srli_epi64(s, 32));
      c0 = _mm_add_epi64(c0, c0_even);
      c0 = _mm_add_epi64(c0, c0_odd);
    }
  }
  const __m128i h00_val = _mm_add_epi64(h00, _mm_srli_si128(h00, 8));

  const __m128i c0_val = _mm_add_epi64(c0, _mm_srli_si128(c0, 8));

  const __m128i c = _mm_unpacklo_epi64(c0_val, zero);
  const __m128i h0x = _mm_unpacklo_epi64(h00_val, zero);

  xx_storeu_128(C, c);
  xx_storeu_128(H[0], h0x);

  H[0][0] /= size;
  C[0] /= size;
}